

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O0

bool __thiscall
HeadersSyncState::ValidateAndStoreHeadersCommitments
          (HeadersSyncState *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  long lVar1;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  size_type sVar3;
  reference current;
  HeadersSyncState *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar4;
  undefined1 uVar5;
  CBlockHeader *hdr;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *__range1;
  Level in_stack_00000060;
  long *in_stack_00000078;
  long *in_stack_00000080;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  base_blob<256U> *in_stack_fffffffffffffec0;
  CBlockIndex *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  CBlockHeader *in_stack_fffffffffffffed8;
  HeadersSyncState *flag;
  long lVar6;
  int iVar7;
  bool local_c9;
  ConstevalFormatString<3U> in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff80 [14];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = in_RDI;
  sVar3 = std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::size
                    ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  uVar4 = sVar3 != 0;
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(char *)in_stack_fffffffffffffec0,
             (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  sVar3 = std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::size
                    ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
                     CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (sVar3 == 0) {
    local_c9 = true;
  }
  else {
    uVar5 = *(int *)(in_RDI + 0x1e4) == 0;
    inline_assertion_check<false,bool>
              ((bool *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(char *)in_stack_fffffffffffffec0,
               (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (*(int *)(in_RDI + 0x1e4) == 0) {
      std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::operator[]
                ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffffec8,
                 (size_type)in_stack_fffffffffffffec0);
      CBlockHeader::GetHash(in_stack_fffffffffffffed8);
      bVar2 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      iVar7 = (int)((ulong)lVar6 >> 0x20);
      if (bVar2) {
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                    Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0);
          logging_function._M_str._6_1_ = uVar5;
          logging_function._0_14_ = in_stack_ffffffffffffff80;
          logging_function._M_str._7_1_ = uVar4;
          LogPrintFormatInternal<long,long>
                    (logging_function,in_stack_ffffffffffffff70,iVar7,(LogFlags)in_RSI,
                     in_stack_00000060,(ConstevalFormatString<2U>)in_stack_ffffffffffffff68.fmt,
                     (long *)this,in_stack_00000078);
        }
        local_c9 = false;
      }
      else {
        flag = in_RSI;
        std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::begin
                  ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffffec0)
        ;
        std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::end
                  ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffffec0)
        ;
        while( true ) {
          bVar2 = __gnu_cxx::
                  operator==<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                            ((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                              *)in_stack_fffffffffffffec8,
                             (__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                              *)in_stack_fffffffffffffec0);
          iVar7 = (int)((ulong)lVar6 >> 0x20);
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          current = __gnu_cxx::
                    __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                    ::operator*((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          bVar2 = ValidateAndProcessSingleHeader(in_RSI,current);
          if (!bVar2) {
            local_c9 = false;
            goto LAB_008d7dcd;
          }
          __gnu_cxx::
          __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
          ::operator++((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                        *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        }
        bVar2 = operator>=((base_uint<256U> *)in_stack_fffffffffffffec8,
                           (base_uint<256U> *)in_stack_fffffffffffffec0);
        if (bVar2) {
          std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::clear
                    ((deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)
                     in_stack_fffffffffffffec8);
          *(long *)(in_RDI + 0x178) = (long)*(int *)(*(long *)(in_RDI + 0x18) + 0x18);
          CBlockIndex::GetBlockHash(in_stack_fffffffffffffec8);
          *(undefined8 *)(in_RDI + 0x1a0) = local_50;
          *(undefined8 *)(in_RDI + 0x1a8) = local_48;
          *(undefined8 *)(in_RDI + 0x1b0) = local_40;
          *(undefined8 *)(in_RDI + 0x1b8) = local_38;
          CBlockIndex::GetBlockHash(in_stack_fffffffffffffec8);
          *(undefined8 *)(in_RDI + 0x180) = local_70;
          *(undefined8 *)(in_RDI + 0x188) = local_68;
          *(undefined8 *)(in_RDI + 400) = local_60;
          *(undefined8 *)(in_RDI + 0x198) = local_58;
          arith_uint256::operator=
                    ((arith_uint256 *)in_stack_fffffffffffffec8,
                     (arith_uint256 *)in_stack_fffffffffffffec0);
          *(undefined4 *)(in_RDI + 0x1e4) = 1;
          bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                      Trace);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8
                       ,in_stack_fffffffffffffed0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8
                       ,in_stack_fffffffffffffed0);
            logging_function_00._M_str._6_1_ = uVar5;
            logging_function_00._0_14_ = in_stack_ffffffffffffff80;
            logging_function_00._M_str._7_1_ = uVar4;
            LogPrintFormatInternal<long,long,long>
                      (logging_function_00,in_stack_ffffffffffffff70,iVar7,(LogFlags)flag,
                       in_stack_00000060,in_stack_ffffffffffffff68,(long *)this,in_stack_00000078,
                       in_stack_00000080);
          }
        }
        local_c9 = true;
      }
    }
    else {
      local_c9 = false;
    }
  }
LAB_008d7dcd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c9;
}

Assistant:

bool HeadersSyncState::ValidateAndStoreHeadersCommitments(const std::vector<CBlockHeader>& headers)
{
    // The caller should not give us an empty set of headers.
    Assume(headers.size() > 0);
    if (headers.size() == 0) return true;

    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    if (headers[0].hashPrevBlock != m_last_header_received.GetHash()) {
        // Somehow our peer gave us a header that doesn't connect.
        // This might be benign -- perhaps our peer reorged away from the chain
        // they were on. Give up on this sync for now (likely we will start a
        // new sync with a new starting point).
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (presync phase)\n", m_id, m_current_height);
        return false;
    }

    // If it does connect, (minimally) validate and occasionally store
    // commitments.
    for (const auto& hdr : headers) {
        if (!ValidateAndProcessSingleHeader(hdr)) {
            return false;
        }
    }

    if (m_current_chain_work >= m_minimum_required_work) {
        m_redownloaded_headers.clear();
        m_redownload_buffer_last_height = m_chain_start->nHeight;
        m_redownload_buffer_first_prev_hash = m_chain_start->GetBlockHash();
        m_redownload_buffer_last_hash = m_chain_start->GetBlockHash();
        m_redownload_chain_work = m_chain_start->nChainWork;
        m_download_state = State::REDOWNLOAD;
        LogDebug(BCLog::NET, "Initial headers sync transition with peer=%d: reached sufficient work at height=%i, redownloading from height=%i\n", m_id, m_current_height, m_redownload_buffer_last_height);
    }
    return true;
}